

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterBeam.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::Decode
          (UnderwaterAcousticEmitterBeam *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x17 < KVar1) {
    KDataStream::Read(stream,&this->m_ui8BeamDataLength);
    KDataStream::Read(stream,&this->m_ui8BeamIDNumber);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
    (*(this->m_UAFPD).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_UAFPD,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void UnderwaterAcousticEmitterBeam::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < UNDERWATER_ACOUSTIC_EMITTER_BEAM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8BeamDataLength
           >> m_ui8BeamIDNumber
           >> m_ui16Padding1
           >> KDIS_STREAM m_UAFPD;
}